

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

bool CheckWildcards(char *pattern,char *text)

{
  int iVar1;
  int iVar2;
  char *pattern_00;
  bool bVar3;
  char *pcStack_20;
  char stop;
  char *text_local;
  char *pattern_local;
  
  if ((pattern != (char *)0x0) && (pcStack_20 = text, pattern_00 = pattern, text != (char *)0x0)) {
    do {
      do {
        while( true ) {
          text_local = pattern_00;
          if (*text_local == '\0') {
            return *text_local == '\0' && *pcStack_20 == '\0';
          }
          if (*text_local == '*') break;
          if (*text_local != '?') {
            iVar1 = tolower((int)*text_local);
            iVar2 = tolower((int)*pcStack_20);
            if (iVar1 != iVar2) {
              return false;
            }
          }
          pcStack_20 = pcStack_20 + 1;
          pattern_00 = text_local + 1;
        }
        pattern_00 = text_local + 1;
        iVar1 = tolower((int)text_local[1]);
        while( true ) {
          bVar3 = false;
          if (*pcStack_20 != '\0') {
            iVar2 = tolower((int)*pcStack_20);
            bVar3 = iVar2 != (char)iVar1;
          }
          if (!bVar3) break;
          pcStack_20 = pcStack_20 + 1;
        }
      } while ((*pcStack_20 == '\0') || (iVar2 = tolower((int)*pcStack_20), iVar2 != (char)iVar1));
      bVar3 = CheckWildcards(pattern_00,pcStack_20);
      pcStack_20 = pcStack_20 + 1;
      pattern_00 = text_local;
    } while (!bVar3);
  }
  return true;
}

Assistant:

bool CheckWildcards (const char *pattern, const char *text)
{
	if (pattern == NULL || text == NULL)
		return true;

	while (*pattern)
	{
		if (*pattern == '*')
		{
			char stop = tolower (*++pattern);
			while (*text && tolower(*text) != stop)
			{
				text++;
			}
			if (*text && tolower(*text) == stop)
			{
				if (CheckWildcards (pattern, text++))
				{
					return true;
				}
				pattern--;
			}
		}
		else if (*pattern == '?' || tolower(*pattern) == tolower(*text))
		{
			pattern++;
			text++;
		}
		else
		{
			return false;
		}
	}
	return (*pattern | *text) == 0;
}